

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O0

void CoreC_FileInit(nodemodule *Module)

{
  nodemodule *Module_local;
  
  NodeRegisterClassEx(Module,BufStream_Class);
  NodeRegisterClassEx(Module,MemStream_Class);
  NodeRegisterClassEx(Module,Streams_Class);
  NodeRegisterClassEx(Module,File_Class);
  NodeRegisterClassEx(Module,Stdio_Class);
  return;
}

Assistant:

void CoreC_FileInit(nodemodule* Module)
{
    NodeRegisterClassEx(Module,BufStream_Class);
    NodeRegisterClassEx(Module,MemStream_Class);
    NodeRegisterClassEx(Module,Streams_Class);
    NodeRegisterClassEx(Module,File_Class);
#if defined(CONFIG_STDIO)
    NodeRegisterClassEx(Module,Stdio_Class);
#endif
}